

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser::printMsg(Parser *this,QByteArrayView formatStringSuffix,QByteArrayView msg,Symbol *sym)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  const_pointer pvVar4;
  stack<QByteArray,_QList<QByteArray>_> *this_00;
  uint *in_R9;
  long in_FS_OFFSET;
  QByteArray formatString_1;
  QByteArray formatString;
  QStringBuilder<const_char_(&)[11],_QByteArrayView_&> *in_stack_ffffffffffffff38;
  FILE *pFVar5;
  stack<QByteArray,_QList<QByteArray>_> *in_stack_ffffffffffffff40;
  QByteArrayView local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_R9 == 0xffffffff) {
    ::operator+((char (*) [5])in_stack_ffffffffffffff40,(QByteArrayView *)in_stack_ffffffffffffff38)
    ;
    ::QStringBuilder::operator_cast_to_QByteArray
              ((QStringBuilder<const_char_(&)[5],_QByteArrayView_&> *)in_stack_ffffffffffffff38);
    pFVar5 = _stderr;
    this_00 = (stack<QByteArray,_QList<QByteArray>_> *)QByteArray::constData((QByteArray *)0x17c8b0)
    ;
    std::stack<QByteArray,_QList<QByteArray>_>::top(this_00);
    pcVar2 = QByteArray::constData((QByteArray *)0x17c8cb);
    pvVar4 = QByteArrayView::data(local_28);
    fprintf(pFVar5,(char *)this_00,pcVar2,pvVar4);
    QByteArray::~QByteArray((QByteArray *)0x17c8ff);
  }
  else {
    ::operator+((char (*) [11])in_stack_ffffffffffffff40,(QByteArrayView *)in_stack_ffffffffffffff38
               );
    ::QStringBuilder::operator_cast_to_QByteArray(in_stack_ffffffffffffff38);
    pFVar5 = _stderr;
    pcVar2 = QByteArray::constData((QByteArray *)0x17c7da);
    std::stack<QByteArray,_QList<QByteArray>_>::top(in_stack_ffffffffffffff40);
    pcVar3 = QByteArray::constData((QByteArray *)0x17c7f5);
    uVar1 = *in_R9;
    pvVar4 = QByteArrayView::data(local_28);
    fprintf(pFVar5,pcVar2,pcVar3,(ulong)uVar1,1,pvVar4);
    QByteArray::~QByteArray((QByteArray *)0x17c842);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::printMsg(QByteArrayView formatStringSuffix, QByteArrayView msg, const Symbol &sym)
{
    if (sym.lineNum != -1) {
#ifdef Q_CC_MSVC
        QByteArray formatString = "%s(%d:%d): " + formatStringSuffix;
#else
        QByteArray formatString = "%s:%d:%d: " + formatStringSuffix;
#endif
        fprintf(stderr, formatString.constData(),
                currentFilenames.top().constData(), sym.lineNum, 1, msg.data());
    } else {
        QByteArray formatString = "%s: " + formatStringSuffix;
        fprintf(stderr, formatString.constData(),
                currentFilenames.top().constData(), msg.data());
    }
}